

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock(ThreadSafeArena *this,void *buf,size_t size)

{
  Nullable<const_char_*> failure_msg;
  undefined1 *puVar1;
  uint local_2c;
  LogMessageFatal local_28;
  
  local_28.super_LogMessage._0_8_ = ZEXT48((uint)buf & 7);
  local_2c = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                          ((unsigned_long *)&local_28,&local_2c,
                           "reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (size < 0x11 || buf == (void *)0x0) {
      puVar1 = internal::(anonymous_namespace)::kSentryArenaBlock;
    }
    else {
      *(undefined1 *)buf = 0;
      *(undefined1 *)((long)buf + (size - 1)) = 0;
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
      ArenaBlock::ArenaBlock((ArenaBlock *)buf,(ArenaBlock *)0x0,size);
      puVar1 = (undefined1 *)buf;
    }
    return (ArenaBlock *)puVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x23e,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size) {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);
  if (buf == nullptr || size <= kBlockHeaderSize) {
    return SentryArenaBlock();
  }
  // Record user-owned block.

  if constexpr (internal::PerformDebugChecks()) {
    // Touch block to verify it is addressable.
    if (size > 0) {
      static_cast<char*>(buf)[0] = 0;
      static_cast<char*>(buf)[size - 1] = 0;
    }
  }

  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(buf, size);
  alloc_policy_.set_is_user_owned_initial_block(true);
  return new (buf) ArenaBlock{nullptr, size};
}